

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pla.h
# Opt level: O0

void Pla_ManFree(Pla_Man_t *p)

{
  Pla_Man_t *p_local;
  
  Vec_IntErase(&p->vCubes);
  Vec_IntErase(&p->vHashes);
  Vec_WrdErase(&p->vInBits);
  Vec_WrdErase(&p->vOutBits);
  Vec_WecErase(&p->vCubeLits);
  Vec_WecErase(&p->vOccurs);
  Vec_IntErase(&p->vDivs);
  if (p->pName != (char *)0x0) {
    free(p->pName);
    p->pName = (char *)0x0;
  }
  if (p->pSpec != (char *)0x0) {
    free(p->pSpec);
    p->pSpec = (char *)0x0;
  }
  if (p != (Pla_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

static inline void Pla_ManFree( Pla_Man_t * p )
{
    Vec_IntErase( &p->vCubes );
    Vec_IntErase( &p->vHashes );
    Vec_WrdErase( &p->vInBits );
    Vec_WrdErase( &p->vOutBits );
    Vec_WecErase( &p->vCubeLits );
    Vec_WecErase( &p->vOccurs );
    Vec_IntErase( &p->vDivs );
    ABC_FREE( p->pName );
    ABC_FREE( p->pSpec );
    ABC_FREE( p );
}